

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O2

float * __thiscall sisl::cartesian_cubic<float>::operator()(cartesian_cubic<float> *this,int d0,...)

{
  char in_AL;
  bool bVar1;
  float *pfVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint local_e4;
  int _x;
  uint local_dc;
  va_list vl;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  vl[0].reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  this->__zero = 0.0;
  vl[0].overflow_arg_area = &stack0x00000008;
  local_a8._0_4_ = (uint)in_RDX;
  vl[0].gp_offset = 0x20;
  vl[0].fp_offset = 0x30;
  local_e4 = (uint)local_a8;
  local_dc = (uint)local_a0;
  _x = d0;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  bVar1 = in_bound(this,&_x,(int *)&local_e4,(int *)&local_dc);
  if (bVar1) {
    pfVar2 = array_n<float,_3,_std::allocator<float>_>::operator()
                       (&this->_array,_x,(ulong)local_e4,(ulong)local_dc);
  }
  else {
    pfVar2 = &this->__zero;
  }
  return pfVar2;
}

Assistant:

virtual const T& operator()(int d0, ...) const {
            int _x = d0, _y = 0, _z = 0; va_list vl;
            T *__hack = (T *)&__zero; *__hack = 0; // This gets around the const modifier for this
            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);

            // 

            if(!in_bound(_x,_y, _z)) return __zero;
            return _array(_x, _y, _z);
        }